

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  stbrp_rect *psVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  stbtt_pack_range *psVar7;
  uint uVar8;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  byte *pbVar13;
  long lVar14;
  byte *pbVar15;
  int iVar16;
  int iVar17;
  uchar *puVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  int local_fc;
  int local_f8;
  int lsb;
  int x1;
  int y1;
  long local_e8;
  stbtt_packedchar *local_e0;
  stbtt_pack_range *local_d8;
  stbrp_rect *local_d0;
  ulong local_c8;
  ulong local_c0;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  stbtt_pack_range *local_a8;
  int local_9c;
  int local_98;
  int advance;
  int x0;
  int y0;
  uint local_88;
  uint local_84;
  stbrp_rect *local_80;
  float local_78;
  float local_74;
  stbtt_fontinfo *local_70;
  int local_64;
  stbtt_pack_context *local_60;
  float local_54;
  ulong local_50;
  ulong local_48;
  byte local_40 [12];
  float local_34;
  ulong uVar9;
  
  local_88 = spc->h_oversample;
  local_84 = spc->v_oversample;
  if (num_ranges < 1) {
    local_64 = 1;
  }
  else {
    local_c0 = (ulong)(uint)num_ranges;
    local_64 = 1;
    local_c8 = 0;
    _x1 = 0;
    local_d0 = rects;
    local_a8 = ranges;
    local_70 = info;
    local_60 = spc;
    do {
      local_b8 = local_a8[local_c8].font_size;
      if (local_b8 <= 0.0) {
        uStack_b4 = 0x80000000;
        uStack_b0 = 0x80000000;
        uStack_ac = 0x80000000;
        local_b8 = -local_b8;
        uVar12 = (uint)(ushort)(*(ushort *)(local_70->data + (long)local_70->head + 0x12) << 8 |
                               *(ushort *)(local_70->data + (long)local_70->head + 0x12) >> 8);
      }
      else {
        puVar18 = local_70->data;
        lVar6 = (long)local_70->hhea;
        uVar12 = ((int)(short)((ushort)puVar18[lVar6 + 4] << 8) | (uint)puVar18[lVar6 + 5]) -
                 ((int)(short)((ushort)puVar18[lVar6 + 6] << 8) | (uint)puVar18[lVar6 + 7]);
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
      }
      local_b8 = local_b8 / (float)(int)uVar12;
      psVar7 = local_a8 + local_c8;
      bVar2 = psVar7->h_oversample;
      fVar20 = (float)bVar2;
      spc->h_oversample = (uint)bVar2;
      local_78 = 0.0;
      local_74 = 0.0;
      if (bVar2 != 0) {
        local_74 = (float)(int)(1 - (uint)bVar2) / (fVar20 + fVar20);
      }
      bVar2 = psVar7->v_oversample;
      spc->v_oversample = (uint)bVar2;
      fVar21 = (float)bVar2;
      if (bVar2 != 0) {
        local_78 = (float)(int)(1 - (uint)bVar2) / (fVar21 + fVar21);
      }
      iVar16 = psVar7->num_chars;
      if (0 < iVar16) {
        x0 = (int)(1.0 / fVar20);
        y0 = (int)(1.0 / fVar21);
        _x1 = (long)(int)_x1;
        local_e8 = 0;
        local_d8 = psVar7;
        do {
          if (rects[_x1].was_packed == 0) {
            local_64 = 0;
          }
          else {
            if (psVar7->array_of_unicode_codepoints == (int *)0x0) {
              iVar16 = psVar7->first_unicode_codepoint_in_range + (int)local_e8;
            }
            else {
              iVar16 = psVar7->array_of_unicode_codepoints[local_e8];
            }
            psVar1 = rects + _x1;
            local_e0 = psVar7->chardata_for_range + local_e8;
            local_34 = (float)stbtt_FindGlyphIndex(local_70,iVar16);
            iVar16 = spc->padding;
            lVar6 = (long)psVar1->x + (long)iVar16;
            psVar1->x = (stbrp_coord)lVar6;
            iVar19 = psVar1->y + iVar16;
            psVar1->y = iVar19;
            iVar17 = psVar1->w - iVar16;
            psVar1->w = iVar17;
            iVar16 = psVar1->h - iVar16;
            psVar1->h = iVar16;
            stbtt_GetGlyphHMetrics(local_70,(int)local_34,&local_9c,&local_fc);
            local_48 = (ulong)local_60->h_oversample;
            local_80 = (stbrp_rect *)(ulong)local_60->v_oversample;
            local_50 = CONCAT44(local_50._4_4_,(float)local_48 * local_b8);
            local_54 = (float)(long)local_80 * local_b8;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (local_70,(int)local_34,(float)local_48 * local_b8,local_54,0.0,0.0,&local_98,
                       &advance,&local_f8,&lsb);
            spc = local_60;
            stbtt_MakeGlyphBitmapSubpixel
                      (local_70,local_60->pixels + iVar19 * local_60->stride_in_bytes + lVar6,
                       (iVar17 - (int)(float)local_48) + 1,(iVar16 - (int)local_80) + 1,
                       local_60->stride_in_bytes,(float)local_50,local_54,0.0,0.0,(int)local_34);
            uVar12 = spc->h_oversample;
            iVar16 = psVar1->x;
            iVar17 = psVar1->y;
            iVar19 = psVar1->w;
            fVar20 = (float)psVar1->h;
            local_80 = psVar1;
            if (1 < (ulong)uVar12) {
              local_40[0] = 0;
              local_40[1] = 0;
              local_40[2] = 0;
              local_40[3] = 0;
              local_40[4] = 0;
              local_40[5] = 0;
              local_40[6] = 0;
              local_40[7] = 0;
              if (0 < (int)fVar20) {
                puVar18 = spc->pixels + (long)iVar17 * (long)spc->stride_in_bytes + (long)iVar16;
                local_50 = (ulong)(iVar19 - uVar12);
                uVar8 = (iVar19 - uVar12) + 1;
                uVar9 = (ulong)uVar8;
                fVar21 = 0.0;
                local_48 = (long)spc->stride_in_bytes;
                local_34 = fVar20;
                do {
                  local_54 = fVar21;
                  memset(local_40,0,(ulong)uVar12);
                  fVar20 = local_34;
                  uVar4 = uVar8;
                  switch(uVar12) {
                  case 2:
                    if ((int)(float)local_50 < 0) {
LAB_00109347:
                      uVar5 = 0;
                      uVar4 = 0;
                    }
                    else {
                      uVar11 = 0;
                      uVar5 = 0;
                      do {
                        bVar2 = puVar18[uVar11];
                        bVar3 = local_40[(uint)uVar11 & 7];
                        local_40[(uint)uVar11 + 2 & 7] = bVar2;
                        uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                        puVar18[uVar11] = (uchar)(uVar5 >> 1);
                        uVar11 = uVar11 + 1;
                      } while (uVar9 != uVar11);
                    }
                    break;
                  case 3:
                    if ((int)(float)local_50 < 0) goto LAB_00109347;
                    uVar11 = 0;
                    uVar5 = 0;
                    do {
                      bVar2 = puVar18[uVar11];
                      bVar3 = local_40[(uint)uVar11 & 7];
                      local_40[(uint)uVar11 + 3 & 7] = bVar2;
                      uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                      puVar18[uVar11] = (uchar)(uVar5 / 3);
                      uVar11 = uVar11 + 1;
                    } while (uVar9 != uVar11);
                    break;
                  case 4:
                    if ((int)(float)local_50 < 0) goto LAB_00109347;
                    uVar11 = 0;
                    uVar5 = 0;
                    do {
                      bVar2 = puVar18[uVar11];
                      uVar10 = (ulong)((uint)uVar11 & 7);
                      local_40[uVar10 ^ 4] = bVar2;
                      uVar5 = uVar5 + ((uint)bVar2 - (uint)local_40[uVar10]);
                      puVar18[uVar11] = (uchar)(uVar5 >> 2);
                      uVar11 = uVar11 + 1;
                    } while (uVar9 != uVar11);
                    break;
                  case 5:
                    if ((int)(float)local_50 < 0) goto LAB_00109347;
                    uVar11 = 0;
                    uVar5 = 0;
                    do {
                      bVar2 = puVar18[uVar11];
                      bVar3 = local_40[(uint)uVar11 & 7];
                      local_40[(uint)uVar11 + 5 & 7] = bVar2;
                      uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                      puVar18[uVar11] = (uchar)(uVar5 / 5);
                      uVar11 = uVar11 + 1;
                      fVar20 = local_34;
                    } while (uVar9 != uVar11);
                    break;
                  default:
                    if ((int)(float)local_50 < 0) goto LAB_00109347;
                    uVar11 = 0;
                    uVar5 = 0;
                    do {
                      bVar2 = puVar18[uVar11];
                      bVar3 = local_40[(uint)uVar11 & 7];
                      local_40[(uint)uVar11 + uVar12 & 7] = bVar2;
                      uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                      puVar18[uVar11] = (uchar)(uVar5 / uVar12);
                      uVar11 = uVar11 + 1;
                    } while (uVar9 != uVar11);
                  }
                  if ((int)uVar4 < iVar19) {
                    uVar11 = (ulong)uVar4;
                    do {
                      if (puVar18[uVar11] != '\0') {
                        __assert_fail("pixels[i] == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0xadd,
                                      "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                     );
                      }
                      uVar5 = uVar5 - local_40[(uint)uVar11 & 7];
                      puVar18[uVar11] = (uchar)(uVar5 / uVar12);
                      uVar11 = uVar11 + 1;
                    } while ((int)uVar11 < iVar19);
                  }
                  puVar18 = puVar18 + local_48;
                  fVar21 = (float)((int)local_54 + 1);
                } while (fVar21 != fVar20);
                iVar16 = local_80->x;
                iVar17 = local_80->y;
                iVar19 = local_80->w;
                fVar20 = (float)local_80->h;
                spc = local_60;
              }
            }
            uVar12 = spc->v_oversample;
            if (1 < (ulong)uVar12) {
              lVar6 = (long)spc->stride_in_bytes;
              local_40[0] = 0;
              local_40[1] = 0;
              local_40[2] = 0;
              local_40[3] = 0;
              local_40[4] = 0;
              local_40[5] = 0;
              local_40[6] = 0;
              local_40[7] = 0;
              if (0 < iVar19) {
                pbVar15 = spc->pixels + iVar17 * lVar6 + (long)iVar16;
                local_50 = (ulong)((int)fVar20 - uVar12);
                uVar8 = ((int)fVar20 - uVar12) + 1;
                uVar9 = (ulong)uVar8;
                fVar21 = 0.0;
                local_48 = CONCAT44(local_48._4_4_,iVar19);
                local_34 = fVar20;
                do {
                  local_54 = fVar21;
                  memset(local_40,0,(ulong)uVar12);
                  fVar20 = local_34;
                  uVar4 = uVar8;
                  switch(uVar12) {
                  case 2:
                    if ((int)(float)local_50 < 0) {
LAB_0010957c:
                      uVar5 = 0;
                      uVar4 = 0;
                    }
                    else {
                      uVar11 = 0;
                      uVar5 = 0;
                      pbVar13 = pbVar15;
                      do {
                        bVar2 = *pbVar13;
                        bVar3 = local_40[(uint)uVar11 & 7];
                        local_40[(uint)uVar11 + 2 & 7] = bVar2;
                        uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                        *pbVar13 = (byte)(uVar5 >> 1);
                        uVar11 = uVar11 + 1;
                        pbVar13 = pbVar13 + lVar6;
                      } while (uVar9 != uVar11);
                    }
                    break;
                  case 3:
                    if ((int)(float)local_50 < 0) goto LAB_0010957c;
                    uVar11 = 0;
                    uVar5 = 0;
                    pbVar13 = pbVar15;
                    do {
                      bVar2 = *pbVar13;
                      bVar3 = local_40[(uint)uVar11 & 7];
                      local_40[(uint)uVar11 + 3 & 7] = bVar2;
                      uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                      *pbVar13 = (byte)(uVar5 / 3);
                      uVar11 = uVar11 + 1;
                      pbVar13 = pbVar13 + lVar6;
                      fVar20 = local_34;
                    } while (uVar9 != uVar11);
                    break;
                  case 4:
                    if ((int)(float)local_50 < 0) goto LAB_0010957c;
                    uVar11 = 0;
                    uVar5 = 0;
                    pbVar13 = pbVar15;
                    do {
                      bVar2 = *pbVar13;
                      uVar10 = (ulong)((uint)uVar11 & 7);
                      local_40[uVar10 ^ 4] = bVar2;
                      uVar5 = uVar5 + ((uint)bVar2 - (uint)local_40[uVar10]);
                      *pbVar13 = (byte)(uVar5 >> 2);
                      uVar11 = uVar11 + 1;
                      pbVar13 = pbVar13 + lVar6;
                    } while (uVar9 != uVar11);
                    break;
                  case 5:
                    if ((int)(float)local_50 < 0) goto LAB_0010957c;
                    uVar11 = 0;
                    uVar5 = 0;
                    pbVar13 = pbVar15;
                    do {
                      bVar2 = *pbVar13;
                      bVar3 = local_40[(uint)uVar11 & 7];
                      local_40[(uint)uVar11 + 5 & 7] = bVar2;
                      uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                      *pbVar13 = (byte)(uVar5 / 5);
                      uVar11 = uVar11 + 1;
                      pbVar13 = pbVar13 + lVar6;
                      fVar20 = local_34;
                    } while (uVar9 != uVar11);
                    break;
                  default:
                    if ((int)(float)local_50 < 0) {
                      uVar5 = 0;
                      uVar4 = 0;
                    }
                    else {
                      uVar11 = 0;
                      uVar5 = 0;
                      pbVar13 = pbVar15;
                      do {
                        bVar2 = *pbVar13;
                        bVar3 = local_40[(uint)uVar11 & 7];
                        local_40[(uint)uVar11 + uVar12 & 7] = bVar2;
                        uVar5 = uVar5 + ((uint)bVar2 - (uint)bVar3);
                        *pbVar13 = (byte)(uVar5 / uVar12);
                        uVar11 = uVar11 + 1;
                        pbVar13 = pbVar13 + lVar6;
                      } while (uVar9 != uVar11);
                    }
                  }
                  iVar16 = (int)fVar20 - uVar4;
                  if (iVar16 != 0 && (int)uVar4 <= (int)fVar20) {
                    lVar14 = (long)(int)uVar4;
                    pbVar13 = pbVar15 + lVar6 * lVar14;
                    do {
                      if (*pbVar13 != 0) {
                        __assert_fail("pixels[i*stride_in_bytes] == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0xb1b,
                                      "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                     );
                      }
                      uVar5 = uVar5 - local_40[(uint)lVar14 & 7];
                      *pbVar13 = (byte)(uVar5 / uVar12);
                      lVar14 = lVar14 + 1;
                      pbVar13 = pbVar13 + lVar6;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                  pbVar15 = pbVar15 + 1;
                  fVar21 = (float)((int)local_54 + 1);
                } while (fVar21 != (float)local_48);
                iVar16 = local_80->x;
                iVar17 = local_80->y;
                iVar19 = local_80->w;
                fVar20 = (float)local_80->h;
                spc = local_60;
              }
            }
            local_e0->x0 = (unsigned_short)iVar16;
            local_e0->y0 = (unsigned_short)iVar17;
            local_e0->x1 = (unsigned_short)iVar16 + (short)iVar19;
            local_e0->y1 = (unsigned_short)iVar17 + SUB42(fVar20,0);
            local_e0->xadvance = (float)local_9c * local_b8;
            local_e0->xoff = (float)local_98 * (float)x0 + local_74;
            local_e0->yoff = (float)advance * (float)y0 + local_78;
            local_e0->xoff2 = (float)(local_98 + iVar19) * (float)x0 + local_74;
            local_e0->yoff2 = (float)(advance + (int)fVar20) * (float)y0 + local_78;
            iVar16 = local_d8->num_chars;
            psVar7 = local_d8;
            rects = local_d0;
          }
          _x1 = _x1 + 1;
          local_e8 = local_e8 + 1;
        } while (local_e8 < iVar16);
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 != local_c0);
  }
  spc->h_oversample = local_88;
  spc->v_oversample = local_84;
  return local_64;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}